

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

char __thiscall absl::lts_20240722::Cord::operator[](Cord *this,size_t i)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  CordRep *pCVar6;
  
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  uVar3 = (ulong)(char)bVar1;
  if ((uVar3 & 1) == 0) {
    uVar4 = uVar3 >> 1;
  }
  else {
    uVar4 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (i < uVar4) {
    pCVar6 = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if (pCVar6 == (CordRep *)0x0 || (bVar1 & 1) == 0) {
      pcVar5 = (char *)0x0;
      if ((uVar3 & 1) == 0) {
        pcVar5 = (this->contents_).data_.rep_.field_0.data + 1;
      }
      return pcVar5[i];
    }
    this = (Cord *)pCVar6;
    if (pCVar6->tag != '\x02') goto LAB_0010f1b0;
  }
  else {
    operator[]();
  }
  pCVar6 = (CordRep *)
           (((InlineRep *)&((CordRep *)this)[1].length)->data_).rep_.field_0.as_tree.cordz_info;
LAB_0010f1b0:
  while( true ) {
    if (pCVar6 == (CordRep *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x48d,"char absl::Cord::operator[](size_t) const");
    }
    if ((ulong)(((InlineRep *)&pCVar6->length)->data_).rep_.field_0.as_tree.cordz_info <= i) {
      __assert_fail("offset < rep->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x48e,"char absl::Cord::operator[](size_t) const");
    }
    bVar1 = pCVar6->tag;
    if (5 < bVar1) {
      if ((6 < bVar1 - 0xf9) && (5 < bVar1)) {
        return pCVar6->storage[i];
      }
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    if (bVar1 != 1) break;
    i = i + (((InlineRep *)&pCVar6[1].length)->data_).rep_.field_0.as_tree.cordz_info;
    pCVar6 = *(CordRep **)&pCVar6[1].refcount.count_;
  }
  if (bVar1 == 5) {
    return *(char *)(*(long *)&(((InlineRep *)&pCVar6[1].length)->data_).rep_ + i);
  }
  if (bVar1 != 3) {
    __assert_fail("rep->IsSubstring()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x499,"char absl::Cord::operator[](size_t) const");
  }
  cVar2 = absl::lts_20240722::cord_internal::CordRepBtree::GetCharacter((ulong)pCVar6);
  return cVar2;
}

Assistant:

char Cord::operator[](size_t i) const {
  ABSL_HARDENING_ASSERT(i < size());
  size_t offset = i;
  const CordRep* rep = contents_.tree();
  if (rep == nullptr) {
    return contents_.data()[i];
  }
  rep = cord_internal::SkipCrcNode(rep);
  while (true) {
    assert(rep != nullptr);
    assert(offset < rep->length);
    if (rep->IsFlat()) {
      // Get the "i"th character directly from the flat array.
      return rep->flat()->Data()[offset];
    } else if (rep->IsBtree()) {
      return rep->btree()->GetCharacter(offset);
    } else if (rep->IsExternal()) {
      // Get the "i"th character from the external array.
      return rep->external()->base[offset];
    } else {
      // This must be a substring a node, so bypass it to get to the child.
      assert(rep->IsSubstring());
      offset += rep->substring()->start;
      rep = rep->substring()->child;
    }
  }
}